

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamToolsIndex::WriteHeader(BamToolsIndex *this)

{
  long lVar1;
  size_type sVar2;
  undefined8 uVar3;
  long in_RDI;
  int expectedBytes;
  int32_t numReferences;
  uint32_t blockSize;
  int32_t currentVersion;
  int64_t numBytesWritten;
  allocator local_79;
  string local_78 [8];
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  BamException *in_stack_ffffffffffffffa0;
  allocator local_41;
  string local_40 [32];
  undefined4 local_20;
  int32_t local_1c;
  uint32_t local_18;
  int32_t local_14;
  long local_10;
  
  local_10 = 0;
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x40))(*(long **)(in_RDI + 0x60),"BTI\x01",4);
  local_10 = lVar1 + local_10;
  local_14 = *(int32_t *)(in_RDI + 0x58);
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(&local_14);
  }
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x40))(*(long **)(in_RDI + 0x60),&local_14,4);
  local_10 = lVar1 + local_10;
  local_18 = *(uint32_t *)(in_RDI + 0x50);
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(&local_18);
  }
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x40))(*(long **)(in_RDI + 0x60),&local_18,4);
  local_10 = lVar1 + local_10;
  sVar2 = std::
          vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
          ::size((vector<BamTools::Internal::BtiReferenceSummary,_std::allocator<BamTools::Internal::BtiReferenceSummary>_>
                  *)(in_RDI + 0x38));
  local_1c = (int32_t)sVar2;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(&local_1c);
  }
  lVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x40))(*(long **)(in_RDI + 0x60),&local_1c,4);
  local_10 = lVar1 + local_10;
  local_20 = 0x10;
  if (local_10 != 0x10) {
    uVar3 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"BamToolsIndex::WriteHeader",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"could not write BTI header",&local_79);
    BamException::BamException
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamToolsIndex::WriteHeader()
{

    int64_t numBytesWritten = 0;

    // write BTI index format 'magic number'
    numBytesWritten += m_resources.Device->Write(BamToolsIndex::BTI_MAGIC, 4);

    // write BTI index format version
    int32_t currentVersion = (int32_t)m_outputVersion;
    if (m_isBigEndian) SwapEndian_32(currentVersion);
    numBytesWritten +=
        m_resources.Device->Write((const char*)&currentVersion, sizeof(currentVersion));

    // write block size
    uint32_t blockSize = m_blockSize;
    if (m_isBigEndian) SwapEndian_32(blockSize);
    numBytesWritten += m_resources.Device->Write((const char*)&blockSize, sizeof(blockSize));

    // write number of references
    int32_t numReferences = m_indexFileSummary.size();
    if (m_isBigEndian) SwapEndian_32(numReferences);
    numBytesWritten +=
        m_resources.Device->Write((const char*)&numReferences, sizeof(numReferences));

    // check header written ok
    const int expectedBytes =
        4 + sizeof(currentVersion) + sizeof(blockSize) + sizeof(numReferences);
    if (numBytesWritten != expectedBytes)
        throw BamException("BamToolsIndex::WriteHeader", "could not write BTI header");
}